

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

Nullable<absl::cord_internal::CordRep_*> __thiscall
absl::lts_20240722::Cord::InlineRep::clear(InlineRep *this)

{
  bool bVar1;
  Nullable<absl::cord_internal::CordzInfo_*> pCVar2;
  Nullable<absl::cord_internal::CordRep_*> pCVar3;
  CordRep *result;
  InlineRep *this_local;
  
  bVar1 = is_tree(this);
  if ((bVar1) &&
     (pCVar2 = cordz_info(this), pCVar2 != (Nullable<absl::cord_internal::CordzInfo_*>)0x0)) {
    absl::lts_20240722::cord_internal::CordzInfo::Untrack();
  }
  pCVar3 = tree(this);
  ResetToEmpty(this);
  return pCVar3;
}

Assistant:

inline absl::Nullable<absl::cord_internal::CordRep*> Cord::InlineRep::clear() {
  if (is_tree()) {
    CordzInfo::MaybeUntrackCord(cordz_info());
  }
  absl::cord_internal::CordRep* result = tree();
  ResetToEmpty();
  return result;
}